

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int init_declarator(sym_t *s)

{
  int iVar1;
  int iVar2;
  node_t pvVar3;
  node_t left;
  socklen_t *__addr_len;
  sockaddr *in_RSI;
  
  iVar1 = declarator(s);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    iVar2 = accept(0x3d,in_RSI,__addr_len);
    iVar1 = 1;
    if (iVar2 != 0) {
      pvVar3 = assignment_expression();
      if (pvVar3 == (node_t)0x0) {
        err(E,"expected expression after \'=\'");
      }
      else {
        left = identifier(s->id);
        pvVar3 = binop(0x3d,left,pvVar3);
        ast_add_node(pvVar3);
        if (s->function != 0) {
          err(E,"function \'%s\' declared like a variable",s);
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int init_declarator(sym_t* s)
{
    if (declarator(s))
    {
        if (accept('='))
        {
            if (initializer(s))
            {
                if (s->function)
                    err(E, "function '%s' declared like a variable", s->id);
            }
            else
                err(E, "expected expression after '='");
        }
        return 1;
    }
    return 0;
}